

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O2

int dynamicGetchar(gdIOCtxPtr ctx)

{
  int iVar1;
  uint uVar2;
  uchar b;
  
  iVar1 = dynamicGetbuf(ctx,&b,1);
  uVar2 = 0xffffffff;
  if (iVar1 == 1) {
    uVar2 = (uint)b;
  }
  return uVar2;
}

Assistant:

static int dynamicGetchar(gdIOCtxPtr ctx)
{
	unsigned char b;
	int rv;

	rv = dynamicGetbuf(ctx, &b, 1);

	if(rv != 1) {
		return EOF;
	} else {
		return b; /* (b & 0xff); */
	}
}